

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
djb::matrix::eigenvector
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,matrix *this,
          int iterations)

{
  vector<double,_std::allocator<double>_> *v;
  vector<double,_std::allocator<double>_> *out;
  double dVar1;
  int iVar2;
  pointer pdVar3;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  double dVar9;
  vector<double,_std::allocator<double>_> vec [2];
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> vStack_50;
  ulong uVar8;
  
  vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(&local_68,(long)this->size);
  std::vector<double,_std::allocator<double>_>::reserve(&vStack_50,(long)this->size);
  iVar2 = this->size;
  if (0 < (long)iVar2) {
    lVar5 = 0;
    do {
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] = 1.0;
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
  }
  uVar7 = 0;
  if (0 < iterations) {
    uVar8 = uVar7;
    uVar7 = 0;
    do {
      v = &local_68 + uVar7;
      uVar7 = (ulong)(1 - (int)uVar7);
      out = &local_68 + uVar7;
      transform(this,v,out);
      if ((long)this->size < 1) {
        dVar9 = 0.0;
      }
      else {
        dVar9 = 0.0;
        lVar5 = 0;
        do {
          dVar1 = (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
          dVar9 = dVar9 + dVar1 * dVar1;
          lVar5 = lVar5 + 1;
        } while (this->size != lVar5);
      }
      if (0.0 < dVar9) {
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        iVar2 = this->size;
        if (0 < (long)iVar2) {
          pdVar3 = (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar5 = 0;
          do {
            pdVar3[lVar5] = pdVar3[lVar5] * (1.0 / dVar9);
            lVar5 = lVar5 + 1;
          } while (iVar2 != lVar5);
        }
      }
      uVar6 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar6;
    } while (uVar6 != iterations);
  }
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,&local_68 + uVar7);
  lVar5 = 0x18;
  do {
    pvVar4 = *(void **)((long)&local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> matrix::eigenvector(int iterations) const
{
	std::vector<double> vec[2];
	int j = 0;

	vec[0].reserve(size);
	vec[1].reserve(size);

	for (int i = 0; i < size; ++i)
		vec[j][i] = 1.0;
	for (int i = 0; i < iterations; ++i) {
		double nrm = 0;

		transform(vec[j], vec[1-j]);

#if 1
		// normalize the vector
		for (int k = 0; k < size; ++k)
			nrm+= sqr(vec[1-j][k]);
		if (nrm > 0) {
			nrm = inversesqrt(nrm);

			for (int k = 0; k < size; ++k)
				vec[1-j][k]*= nrm;
		}
#endif

		j = 1 - j;
	}

	return vec[j];
}